

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

char * err_set_loglevel_str(char *lvl)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  
  if (lvl != (char *)0x0) {
    ppcVar5 = err_level;
    pcVar1 = err_level[min_loglevel];
    iVar2 = strncmp(lvl,"ERR_",4);
    lVar4 = 0;
    do {
      iVar3 = strcmp(lvl + (ulong)(iVar2 == 0) * 4,*ppcVar5);
      if (iVar3 == 0) {
        min_loglevel = (err_lvl_t)lVar4;
        return pcVar1;
      }
      lVar4 = lVar4 + 1;
      ppcVar5 = ppcVar5 + 1;
    } while (lVar4 != 5);
  }
  return (char *)0x0;
}

Assistant:

const char *
err_set_loglevel_str(char const *lvl)
{
    const char *rv = err_level[min_loglevel];
    int i;

    if (lvl == NULL)
        return NULL;
    if (!strncmp(lvl, "ERR_", 4))
        lvl += 4;
    for (i = 0; i < ERR_MAX; ++i) {
        if (!strcmp(lvl, err_level[i])) {
            min_loglevel = i;
            return rv;
        }
    }
    return NULL;
}